

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetamlevlat.cpp
# Opt level: O2

void __thiscall
EnvironmentNAVXYTHETAMLEVLAT::~EnvironmentNAVXYTHETAMLEVLAT(EnvironmentNAVXYTHETAMLEVLAT *this)

{
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *pvVar1;
  pointer psVar2;
  EnvNAVXYTHETAMLEVLATAddInfoAction_t *pEVar3;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *pvVar4;
  pointer psVar5;
  uchar **ppuVar6;
  int aind;
  long lVar7;
  long lVar8;
  int levelind;
  int xind;
  long lVar9;
  
  (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
  super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation =
       (_func_int **)&PTR_InitializeEnv_0015eb38;
  pvVar1 = this->AddLevelFootprintPolygonV;
  if (pvVar1 != (vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)0x0) {
    psVar2 = pvVar1[-1].super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (psVar2 != (pointer)0x0) {
      lVar8 = (long)psVar2 * 0x18;
      do {
        std::_Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::~_Vector_base
                  ((_Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)
                   ((long)&pvVar1[-1].super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar8));
        lVar8 = lVar8 + -0x18;
      } while (lVar8 != 0);
    }
    operator_delete__(&pvVar1[-1].super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(long)psVar2 * 0x18 + 8);
    this->AddLevelFootprintPolygonV = (vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)0x0;
  }
  if (this->AdditionalInfoinActionsV != (EnvNAVXYTHETAMLEVLATAddInfoAction_t **)0x0) {
    for (lVar8 = 0;
        lVar8 < (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
                EnvNAVXYTHETALATCfg.NumThetaDirs; lVar8 = lVar8 + 1) {
      for (lVar7 = 0; pEVar3 = this->AdditionalInfoinActionsV[lVar8],
          lVar7 < (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
                  EnvNAVXYTHETALATCfg.actionwidth; lVar7 = lVar7 + 1) {
        pvVar4 = pEVar3[lVar7].intersectingcellsV;
        if (pvVar4 != (vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)0x0) {
          psVar5 = pvVar4[-1].super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          if (psVar5 != (pointer)0x0) {
            lVar9 = (long)psVar5 * 0x18;
            do {
              std::_Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::~_Vector_base
                        ((_Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)
                         ((long)&pvVar4[-1].
                                 super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar9));
              lVar9 = lVar9 + -0x18;
            } while (lVar9 != 0);
          }
          operator_delete__(&pvVar4[-1].
                             super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (long)psVar5 * 0x18 + 8);
        }
      }
      if (pEVar3 != (EnvNAVXYTHETAMLEVLATAddInfoAction_t *)0x0) {
        operator_delete__(pEVar3);
      }
    }
    if (this->AdditionalInfoinActionsV != (EnvNAVXYTHETAMLEVLATAddInfoAction_t **)0x0) {
      operator_delete__(this->AdditionalInfoinActionsV);
    }
    this->AdditionalInfoinActionsV = (EnvNAVXYTHETAMLEVLATAddInfoAction_t **)0x0;
  }
  if (this->AddLevelGrid2D != (uchar ***)0x0) {
    for (lVar8 = 0; lVar8 < this->numofadditionalzlevs; lVar8 = lVar8 + 1) {
      for (lVar7 = 0; ppuVar6 = this->AddLevelGrid2D[lVar8],
          lVar7 < (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
                  EnvNAVXYTHETALATCfg.EnvWidth_c; lVar7 = lVar7 + 1) {
        if (ppuVar6[lVar7] != (uchar *)0x0) {
          operator_delete__(ppuVar6[lVar7]);
        }
      }
      if (ppuVar6 != (uchar **)0x0) {
        operator_delete__(ppuVar6);
      }
    }
    if (this->AddLevelGrid2D != (uchar ***)0x0) {
      operator_delete__(this->AddLevelGrid2D);
    }
    this->AddLevelGrid2D = (uchar ***)0x0;
  }
  if (this->AddLevel_cost_possibly_circumscribed_thresh != (uchar *)0x0) {
    operator_delete__(this->AddLevel_cost_possibly_circumscribed_thresh);
    this->AddLevel_cost_possibly_circumscribed_thresh = (uchar *)0x0;
  }
  if (this->AddLevel_cost_inscribed_thresh != (uchar *)0x0) {
    operator_delete__(this->AddLevel_cost_inscribed_thresh);
    this->AddLevel_cost_inscribed_thresh = (uchar *)0x0;
  }
  this->numofadditionalzlevs = 0;
  EnvironmentNAVXYTHETALAT::~EnvironmentNAVXYTHETALAT(&this->super_EnvironmentNAVXYTHETALAT);
  return;
}

Assistant:

EnvironmentNAVXYTHETAMLEVLAT::~EnvironmentNAVXYTHETAMLEVLAT()
{
    if (AddLevelFootprintPolygonV != NULL) {
        delete[] AddLevelFootprintPolygonV;
        AddLevelFootprintPolygonV = NULL;
    }

    if (AdditionalInfoinActionsV != NULL) {
        for (int tind = 0; tind < EnvNAVXYTHETALATCfg.NumThetaDirs; tind++) {
            for (int aind = 0; aind < EnvNAVXYTHETALATCfg.actionwidth; aind++) {
                delete[] AdditionalInfoinActionsV[tind][aind].intersectingcellsV;
            }
            delete[] AdditionalInfoinActionsV[tind];
        }
        delete[] AdditionalInfoinActionsV;
        AdditionalInfoinActionsV = NULL;
    }

    if (AddLevelGrid2D != NULL) {
        for (int levelind = 0; levelind < numofadditionalzlevs; levelind++) {
            for (int xind = 0; xind < EnvNAVXYTHETALATCfg.EnvWidth_c; xind++) {
                delete[] AddLevelGrid2D[levelind][xind];
            }
            delete[] AddLevelGrid2D[levelind];
        }
        delete[] AddLevelGrid2D;
        AddLevelGrid2D = NULL;
    }

    if (AddLevel_cost_possibly_circumscribed_thresh != NULL) {
        delete[] AddLevel_cost_possibly_circumscribed_thresh;
        AddLevel_cost_possibly_circumscribed_thresh = NULL;
    }

    if (AddLevel_cost_inscribed_thresh != NULL) {
        delete[] AddLevel_cost_inscribed_thresh;
        AddLevel_cost_inscribed_thresh = NULL;
    }

    //reset the number of additional levels
    numofadditionalzlevs = 0;
}